

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rfc5444_writer_fragmentation.c
# Opt level: O2

void write_packet(rfc5444_writer *w,rfc5444_writer_target *iface,void *buffer,size_t length)

{
  int *piVar1;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  
  pcVar3 = "Interface 2:";
  if (iface == &small_if) {
    pcVar3 = "Interface 1:";
  }
  piVar1 = &packets_1;
  if (iface == &small_if) {
    piVar1 = &packets_0;
  }
  puts(pcVar3);
  *piVar1 = *piVar1 + 1;
  for (uVar5 = 0; uVar5 < length; uVar5 = uVar5 + 0x20) {
    printf("%04zx:",uVar5);
    uVar2 = uVar5;
    uVar4 = uVar5 | 0x1f;
    if (length < (uVar5 | 0x1f)) {
      uVar4 = length;
    }
    for (; uVar2 < uVar4; uVar2 = uVar2 + 1) {
      pcVar3 = "";
      if ((uVar2 & 3) == 0) {
        pcVar3 = " ";
      }
      printf("%s%02x",pcVar3,(ulong)*(byte *)((long)buffer + uVar2));
    }
    putchar(10);
  }
  putchar(10);
  return;
}

Assistant:

static void write_packet(struct rfc5444_writer *w __attribute__ ((unused)),
    struct rfc5444_writer_target *iface,
    void *buffer, size_t length) {
  size_t i, j;
  uint8_t *buf = buffer;

  if (iface == &small_if) {
    printf("Interface 1:\n");
    packets[0]++;
  }
  else {
    printf("Interface 2:\n");
    packets[1]++;
  }

  for (j=0; j<length; j+=32) {
    printf("%04zx:", j);

    for (i=j; i<length && i < j+31; i++) {
      printf("%s%02x", ((i&3) == 0) ? " " : "", (int)(buf[i]));
    }
    printf("\n");
  }
  printf("\n");
}